

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

Am_Time am_clock(void)

{
  int iVar1;
  Am_Time_Data *in_RDI;
  Am_Time local_28 [4];
  
  if (am_clock()::clock == '\0') {
    iVar1 = __cxa_guard_acquire(&am_clock()::clock);
    if (iVar1 != 0) {
      Am_Time::Am_Time(&am_clock::clock);
      __cxa_atexit(Am_Time::~Am_Time,&am_clock::clock,&__dso_handle);
      __cxa_guard_release(&am_clock()::clock);
    }
  }
  if (Am_Global_Timer_State != Am_TIMERS_SUSPENDED) {
    Am_Time::Now();
    Am_Time::operator=(&am_clock::clock,local_28);
    Am_Time::~Am_Time(local_28);
  }
  Am_Time::Am_Time((Am_Time *)in_RDI,&am_clock::clock);
  return (Am_Time)in_RDI;
}

Assistant:

static inline Am_Time
am_clock()
{
  static Am_Time clock;

  if (Am_Global_Timer_State != Am_TIMERS_SUSPENDED)
    clock = Am_Time::Now();

  return clock;
}